

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O1

int run_test_udp_send_hang_loop(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_idle_t *puVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  uv_udp_send_t *puVar6;
  
  puVar2 = (uv_idle_t *)uv_default_loop();
  iVar4 = 0x59fed0;
  iVar1 = uv_idle_init();
  if (iVar1 == 0) {
    pcVar5 = "192.0.2.3";
    iVar4 = 0x23a3;
    iVar1 = uv_ip4_addr("192.0.2.3",0x23a3,&addr);
    puVar2 = (uv_idle_t *)pcVar5;
    if (iVar1 != 0) goto LAB_0018a8c4;
    puVar2 = (uv_idle_t *)uv_default_loop();
    iVar4 = 0x59ff58;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_0018a8c9;
    buf = (uv_buf_t)uv_buf_init(send_data,0x400);
    puVar2 = &idle_handle;
    iVar4 = 0x18a8dd;
    iVar1 = uv_idle_start();
    if (iVar1 != 0) goto LAB_0018a8ce;
    puVar2 = (uv_idle_t *)uv_default_loop();
    iVar4 = 0;
    uv_run();
    if (loop_hang_called < 0x3e9) goto LAB_0018a8d3;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    iVar4 = 0;
    uv_run(uVar3);
    puVar2 = (uv_idle_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_send_hang_loop_cold_1();
LAB_0018a8c4:
    run_test_udp_send_hang_loop_cold_2();
LAB_0018a8c9:
    run_test_udp_send_hang_loop_cold_3();
LAB_0018a8ce:
    run_test_udp_send_hang_loop_cold_4();
LAB_0018a8d3:
    run_test_udp_send_hang_loop_cold_5();
  }
  run_test_udp_send_hang_loop_cold_6();
  if (send_req.handle == (uv_udp_t *)0x0) {
    puVar6 = (uv_udp_send_t *)puVar2;
    if (puVar2 != &idle_handle) goto LAB_0018a978;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_stop();
    puVar6 = (uv_udp_send_t *)puVar2;
    if (iVar1 != 0) goto LAB_0018a97d;
    if (999 < loop_hang_called) {
      loop_hang_called = loop_hang_called + 1;
      uv_close(&client,0);
      iVar1 = uv_close(&idle_handle,0);
      return iVar1;
    }
    puVar6 = &send_req;
    iVar4 = 0x59ff58;
    loop_hang_called = loop_hang_called + 1;
    iVar1 = uv_udp_send(&send_req,&client,&buf,1,&addr,send_cb);
    if (iVar1 == 0) {
      return extraout_EAX;
    }
  }
  else {
    puVar6 = (uv_udp_send_t *)send_req.handle;
    idle_cb_cold_1();
LAB_0018a978:
    idle_cb_cold_2();
LAB_0018a97d:
    idle_cb_cold_3();
  }
  idle_cb_cold_4();
  if (puVar6 == (uv_udp_send_t *)0x0) {
    send_cb_cold_5();
    puVar2 = (uv_idle_t *)puVar6;
LAB_0018a9d5:
    send_cb_cold_1();
LAB_0018a9da:
    send_cb_cold_2();
  }
  else {
    if ((iVar4 != -0x65) && (iVar4 != 0)) goto LAB_0018a9e4;
    puVar2 = (uv_idle_t *)puVar6;
    if (puVar6->handle != &client) goto LAB_0018a9d5;
    if (puVar6 != &send_req) goto LAB_0018a9da;
    send_req.handle = (uv_udp_t *)0x0;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    if (iVar1 == 0) {
      return extraout_EAX_00;
    }
  }
  send_cb_cold_3();
  puVar6 = (uv_udp_send_t *)puVar2;
LAB_0018a9e4:
  send_cb_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar6,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_hang_loop) {
  ASSERT(0 == uv_idle_init(uv_default_loop(), &idle_handle));

  /* 192.0.2.0/8 is "TEST-NET" and reserved for documentation.
   * Good for us, though. Since we want to have something unreachable.
   */
  ASSERT(0 == uv_ip4_addr("192.0.2.3", TEST_PORT, &addr));

  ASSERT(0 == uv_udp_init(uv_default_loop(), &client));

  buf = uv_buf_init(send_data, sizeof(send_data));

  ASSERT(0 == uv_idle_start(&idle_handle, idle_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(loop_hang_called > 1000);

  MAKE_VALGRIND_HAPPY();
  return 0;
}